

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O2

void __thiscall blc::tools::VFile::refresh(VFile *this)

{
  istream *piVar1;
  exception *this_00;
  string completFile;
  string ligne;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((&this->field_0x28)[*(long *)(*(long *)&this->_file + -0x18)] & 5) == 0) {
    ligne._M_dataplus._M_p = (pointer)&ligne.field_2;
    ligne._M_string_length = 0;
    completFile._M_dataplus._M_p = (pointer)&completFile.field_2;
    completFile._M_string_length = 0;
    ligne.field_2._M_local_buf[0] = '\0';
    completFile.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&this->_file,(string *)&ligne);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+(&local_70,&completFile,&ligne);
      std::operator+(&local_50,&local_70,"\n");
      std::__cxx11::string::operator=((string *)&completFile,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (completFile._M_string_length != 0) {
      std::__cxx11::string::erase((ulong)&completFile,completFile._M_string_length - 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->_cache);
    this->_isClosed = false;
    this->_cursor = 0;
    std::__cxx11::string::~string((string *)&completFile);
    std::__cxx11::string::~string((string *)&ligne);
    return;
  }
  this_00 = (exception *)__cxa_allocate_exception(0x78);
  std::operator+(&local_90,"Impossible to open file ",&this->_fileName);
  error::exception::exception(this_00,&local_90);
  __cxa_throw(this_00,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

void blc::tools::VFile::refresh() {
	if (this->_file) {
		std::string ligne;
		std::string completFile;
		while(getline(this->_file, ligne)) {
			completFile = completFile + ligne + "\n";
		}
		if (completFile.size() > 0)
			completFile.erase(completFile.size()-1);
		this->_cache = completFile;
		this->open();
		this->_cursor = 0;
	} else {
		throw blc::error::exception("Impossible to open file " + this->_fileName);
	}
}